

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_midiplay.cpp
# Opt level: O3

void __thiscall
OPNMIDIplay::realTime_Controller(OPNMIDIplay *this,uint8_t channel,uint8_t type,uint8_t value)

{
  char cVar1;
  ushort uVar2;
  ulong uVar3;
  bool MSB;
  uint32_t sustain_type;
  int iVar4;
  undefined7 in_register_00000011;
  uint uVar5;
  undefined7 in_register_00000031;
  pointer pMVar6;
  uint8_t *puVar7;
  double dVar8;
  
  pMVar6 = (this->m_midiChannels).
           super__Vector_base<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar3 = (ulong)(channel & 0xf);
  if ((CONCAT71(in_register_00000031,channel) & 0xffffffff) <=
      (ulong)(((long)(this->m_midiChannels).
                     super__Vector_base<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar6 >> 6) *
             -0x3333333333333333)) {
    uVar3 = CONCAT71(in_register_00000031,channel) & 0xffffffff;
  }
  iVar4 = (int)CONCAT71(in_register_00000011,type);
  uVar5 = (uint)uVar3;
  if (iVar4 < 0x40) {
    if (iVar4 < 0x20) {
      switch(CONCAT71(in_register_00000011,type) & 0xffffffff) {
      case 0:
        uVar3 = (ulong)((uVar5 & 0xff) * 0x140);
        pMVar6->noteAftertouch[uVar3 + 0xffffffffffffffe5] = value;
        if ((this->m_synthMode & 1) != 0) {
          return;
        }
        puVar7 = pMVar6->noteAftertouch + uVar3 + -0x28;
        cVar1 = value + 0x82;
LAB_0015cb7d:
        puVar7[0xec] = SBORROW1(value,'~') == cVar1 < '\0';
        return;
      case 1:
        pMVar6->noteAftertouch[(ulong)((uVar5 & 0xff) * 0x140) + 0xffffffffffffffea] = value;
        return;
      default:
        goto switchD_0015c845_default;
      case 5:
        uVar3 = (ulong)((uVar5 & 0xff) * 0x140);
        uVar2 = (ushort)value << 7 |
                *(ushort *)(pMVar6->noteAftertouch + uVar3 + 0xffffffffffffffec) & 0x7f;
        *(ushort *)(pMVar6->noteAftertouch + uVar3 + 0xffffffffffffffec) = uVar2;
        goto LAB_0015cb1f;
      case 6:
        MSB = true;
LAB_0015ca24:
        setRPN(this,uVar3 & 0xff,(uint)value,MSB);
        return;
      case 7:
        pMVar6->noteAftertouch[(ulong)((uVar5 & 0xff) * 0x140) + 0xffffffffffffffe7] = value;
        break;
      case 10:
        pMVar6->noteAftertouch[(ulong)((uVar5 & 0xff) * 0x140) + 0xffffffffffffffe9] = value;
        uVar5 = 2;
        goto LAB_0015caf0;
      case 0xb:
        pMVar6->noteAftertouch[(ulong)((uVar5 & 0xff) * 0x140) + 0xffffffffffffffe8] = value;
      }
LAB_0015c9df:
      uVar5 = 4;
LAB_0015caf0:
      noteUpdateAll(this,uVar3 & 0xff,uVar5);
      return;
    }
    if (iVar4 == 0x20) {
      uVar3 = (ulong)((uVar5 & 0xff) * 0x140);
      pMVar6->noteAftertouch[uVar3 + 0xffffffffffffffe4] = value;
      if ((this->m_synthMode & 1) != 0) {
        return;
      }
      puVar7 = pMVar6->noteAftertouch + uVar3 + -0x28;
      value = puVar7[0xd];
      cVar1 = value + 0x82;
      goto LAB_0015cb7d;
    }
    if (iVar4 != 0x25) {
      if (iVar4 != 0x26) {
        return;
      }
      MSB = false;
      goto LAB_0015ca24;
    }
    uVar3 = (ulong)((uVar5 & 0xff) * 0x140);
    uVar2 = (ushort)value |
            *(ushort *)(pMVar6->noteAftertouch + uVar3 + 0xffffffffffffffec) & 0x3f80;
    *(ushort *)(pMVar6->noteAftertouch + uVar3 + 0xffffffffffffffec) = uVar2;
LAB_0015cb1f:
    iVar4 = (uVar5 & 0xff) * 5;
    if ((uVar2 != 0 & pMVar6->noteAftertouch[uVar3 + 0xfffffffffffffff0]) != 1) {
      dVar8 = INFINITY;
      goto LAB_0015cb55;
    }
LAB_0015cb2c:
    dVar8 = exp2((double)uVar2 * -0.000484375);
    dVar8 = dVar8 * 350.0;
    pMVar6 = (this->m_midiChannels).
             super__Vector_base<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>
             ._M_impl.super__Vector_impl_data._M_start;
LAB_0015cb55:
    *(double *)(pMVar6->noteAftertouch + (ulong)(uint)(iVar4 << 6) + 0xfffffffffffffff8) = dVar8;
    return;
  }
  if (iVar4 < 0x62) {
    switch(iVar4) {
    case 0x40:
      uVar5 = uVar5 & 0xff;
      pMVar6->noteAftertouch[(ulong)(uVar5 * 0x140) + 0xffffffffffffffee] = 0x3f < value;
      if (0x3f < value) {
        return;
      }
      sustain_type = 1;
      break;
    case 0x41:
      iVar4 = (uVar5 & 0xff) * 5;
      uVar3 = (ulong)((uVar5 & 0xff) * 0x140);
      dVar8 = INFINITY;
      pMVar6->noteAftertouch[uVar3 + 0xfffffffffffffff0] = 0x3f < value;
      if ((0x3f >= value) ||
         (uVar2 = *(ushort *)(pMVar6->noteAftertouch + uVar3 + 0xffffffffffffffec), uVar2 == 0))
      goto LAB_0015cb55;
      goto LAB_0015cb2c;
    case 0x42:
      uVar5 = uVar5 & 0xff;
      if (0x3f < value) {
        markSostenutoNotes(this,uVar5);
        return;
      }
      sustain_type = 2;
      break;
    case 0x43:
      pMVar6->noteAftertouch[(ulong)((uVar5 & 0xff) * 0x140) + 0xffffffffffffffef] = 0x3f < value;
      return;
    default:
      return;
    case 0x4a:
      pMVar6->_padding2[(ulong)((uVar5 & 0xff) * 0x140) + 0xfffffffffffffffe] = value;
      goto LAB_0015c9df;
    }
LAB_0015cb96:
    killSustainingNotes(this,uVar5,-1,sustain_type);
    return;
  }
  if (0x77 < iVar4) {
    if (iVar4 == 0x78) {
      uVar5 = 0x60;
    }
    else {
      if (iVar4 == 0x79) {
        uVar5 = (uint)(uVar3 & 0xff);
        MIDIchannel::resetAllControllers121
                  ((MIDIchannel *)(pMVar6->noteAftertouch + (ulong)(uVar5 * 0x140) + -0x28));
        noteUpdateAll(this,uVar3 & 0xff,0xe);
        sustain_type = 3;
        goto LAB_0015cb96;
      }
      if (iVar4 != 0x7b) {
        return;
      }
      uVar5 = 0x20;
    }
    goto LAB_0015caf0;
  }
  switch(iVar4) {
  case 0x62:
    uVar3 = (ulong)((uVar5 & 0xff) * 0x140);
    pMVar6->_padding2[uVar3 + 0xfffffffffffffffb] = value;
    break;
  case 99:
    uVar3 = (ulong)((uVar5 & 0xff) * 0x140);
    pMVar6->_padding2[uVar3 + 0xfffffffffffffffc] = value;
    break;
  case 100:
    uVar3 = (ulong)((uVar5 & 0xff) * 0x140);
    pMVar6->_padding2[uVar3 + 0xfffffffffffffffb] = value;
    goto LAB_0015ca82;
  case 0x65:
    uVar3 = (ulong)((uVar5 & 0xff) * 0x140);
    pMVar6->_padding2[uVar3 + 0xfffffffffffffffc] = value;
LAB_0015ca82:
    pMVar6->_padding2[uVar3 + 0xfffffffffffffffd] = '\0';
  default:
    goto switchD_0015c845_default;
  }
  pMVar6->_padding2[uVar3 + 0xfffffffffffffffd] = '\x01';
switchD_0015c845_default:
  return;
}

Assistant:

void OPNMIDIplay::realTime_Controller(uint8_t channel, uint8_t type, uint8_t value)
{
    if(static_cast<size_t>(channel) > m_midiChannels.size())
        channel = channel % 16;
    switch(type)
    {
    case 1: // Adjust vibrato
        //UI.PrintLn("%u:vibrato %d", MidCh,value);
        m_midiChannels[channel].vibrato = value;
        break;

    case 0: // Set bank msb (GM bank)
        m_midiChannels[channel].bank_msb = value;
        if((m_synthMode & Mode_GS) == 0)// Don't use XG drums on GS synth mode
            m_midiChannels[channel].is_xg_percussion = isXgPercChannel(m_midiChannels[channel].bank_msb, m_midiChannels[channel].bank_lsb);
        break;

    case 32: // Set bank lsb (XG bank)
        m_midiChannels[channel].bank_lsb = value;
        if((m_synthMode & Mode_GS) == 0)// Don't use XG drums on GS synth mode
            m_midiChannels[channel].is_xg_percussion = isXgPercChannel(m_midiChannels[channel].bank_msb, m_midiChannels[channel].bank_lsb);
        break;

    case 5: // Set portamento msb
        m_midiChannels[channel].portamento = static_cast<uint16_t>((m_midiChannels[channel].portamento & 0x007F) | (value << 7));
        updatePortamento(channel);
        break;

    case 37: // Set portamento lsb
        m_midiChannels[channel].portamento = static_cast<uint16_t>((m_midiChannels[channel].portamento & 0x3F80) | (value));
        updatePortamento(channel);
        break;

    case 65: // Enable/disable portamento
        m_midiChannels[channel].portamentoEnable = value >= 64;
        updatePortamento(channel);
        break;

    case 7: // Change volume
        m_midiChannels[channel].volume = value;
        noteUpdateAll(channel, Upd_Volume);
        break;

    case 74: // Change brightness
        m_midiChannels[channel].brightness = value;
        noteUpdateAll(channel, Upd_Volume);
        break;

    case 64: // Enable/disable sustain
        m_midiChannels[channel].sustain = (value >= 64);
        if(!m_midiChannels[channel].sustain)
            killSustainingNotes(channel, -1, OpnChannel::LocationData::Sustain_Pedal);
        break;

    case 66: // Enable/disable sostenuto
        if(value >= 64) //Find notes and mark them as sostenutoed
            markSostenutoNotes(channel);
        else
            killSustainingNotes(channel, -1, OpnChannel::LocationData::Sustain_Sostenuto);
        break;

    case 67: // Enable/disable soft-pedal
        m_midiChannels[channel].softPedal = (value >= 64);
        break;

    case 11: // Change expression (another volume factor)
        m_midiChannels[channel].expression = value;
        noteUpdateAll(channel, Upd_Volume);
        break;

    case 10: // Change panning
        m_midiChannels[channel].panning = value;
        noteUpdateAll(channel, Upd_Pan);
        break;

    case 121: // Reset all controllers
        m_midiChannels[channel].resetAllControllers121();
        noteUpdateAll(channel, Upd_Pan + Upd_Volume + Upd_Pitch);
        // Kill all sustained notes
        killSustainingNotes(channel, -1, OpnChannel::LocationData::Sustain_ANY);
        break;

    case 120: // All sounds off
        noteUpdateAll(channel, Upd_OffMute);
        break;

    case 123: // All notes off
        noteUpdateAll(channel, Upd_Off);
        break;

    case 91:
        break; // Reverb effect depth. We don't do per-channel reverb.

    case 92:
        break; // Tremolo effect depth. We don't do...

    case 93:
        break; // Chorus effect depth. We don't do.

    case 94:
        break; // Celeste effect depth. We don't do.

    case 95:
        break; // Phaser effect depth. We don't do.

    case 98:
        m_midiChannels[channel].lastlrpn = value;
        m_midiChannels[channel].nrpn = true;
        break;

    case 99:
        m_midiChannels[channel].lastmrpn = value;
        m_midiChannels[channel].nrpn = true;
        break;

    case 100:
        m_midiChannels[channel].lastlrpn = value;
        m_midiChannels[channel].nrpn = false;
        break;

    case 101:
        m_midiChannels[channel].lastmrpn = value;
        m_midiChannels[channel].nrpn = false;
        break;

    case 113:
        break; // Related to pitch-bender, used by missimp.mid in Duke3D

    case  6:
        setRPN(channel, value, true);
        break;

    case 38:
        setRPN(channel, value, false);
        break;

    //case 103:
    //    cmf_percussion_mode = (value != 0);
    //    break; // CMF (ctrl 0x67) rhythm mode

    default:
        break;
        //UI.PrintLn("Ctrl %d <- %d (ch %u)", ctrlno, value, MidCh);
    }
}